

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::SetCV(ON_NurbsCurve *this,int i,ON_3dPoint *point)

{
  uint uVar1;
  double *pdVar2;
  
  pdVar2 = this->m_cv + (long)i * (long)this->m_cv_stride;
  if (this->m_cv == (double *)0x0) {
    pdVar2 = (double *)0x0;
  }
  if (pdVar2 != (double *)0x0) {
    *pdVar2 = point->x;
    uVar1 = this->m_dim;
    if (((1 < (int)uVar1) && (pdVar2[1] = point->y, uVar1 != 2)) &&
       (pdVar2[2] = point->z, 3 < uVar1)) {
      memset(pdVar2 + 3,0,(ulong)(uVar1 - 3) << 3);
    }
    if (this->m_is_rat != 0) {
      pdVar2[this->m_dim] = 1.0;
    }
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return pdVar2 != (double *)0x0;
}

Assistant:

bool 
ON_NurbsCurve::SetCV( int i, const ON_3dPoint& point )
{
  bool rc = false;
  double* cv = CV(i);
  if ( cv ) {
    cv[0] = point.x;
    if ( m_dim > 1 ) {
      cv[1] = point.y;
      if ( m_dim > 2 )
        cv[2] = point.z;
      if ( m_dim > 3 ) {
        memset( &cv[3], 0, (m_dim-3)*sizeof(*cv) );
      }
    }
    if ( m_is_rat ) {
      cv[m_dim] = 1.0;
    }
    rc = true;
  }
	DestroyCurveTree();
  return rc;
}